

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O0

int __thiscall QFontEngineFT::synthesized(QFontEngineFT *this)

{
  int s;
  QFontEngineFT *this_local;
  
  s = 0;
  if (((*(ulong *)&(this->super_QFontEngine).fontDef.field_0x60 >> 0x1c & 3) != 0) &&
     ((this->freetype->face->style_flags & 1U) == 0)) {
    s = 1;
  }
  if ((699 < ((uint)((ulong)*(undefined8 *)&(this->super_QFontEngine).fontDef.field_0x60 >> 0x28) &
             0x3ff)) && ((this->freetype->face->style_flags & 2U) == 0)) {
    s = s | 2;
  }
  if ((((uint)((ulong)*(undefined8 *)&(this->super_QFontEngine).fontDef.field_0x60 >> 0x10) & 0xfff)
       != 100) && ((this->freetype->face->face_flags & 1U) != 0)) {
    s = s | 4;
  }
  return s;
}

Assistant:

int QFontEngineFT::synthesized() const
{
    int s = 0;
    if ((fontDef.style != QFont::StyleNormal) && !(freetype->face->style_flags & FT_STYLE_FLAG_ITALIC))
        s = SynthesizedItalic;
    if ((fontDef.weight >= QFont::Bold) && !(freetype->face->style_flags & FT_STYLE_FLAG_BOLD))
        s |= SynthesizedBold;
    if (fontDef.stretch != 100 && FT_IS_SCALABLE(freetype->face))
        s |= SynthesizedStretch;
    return s;
}